

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O1

optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> * __thiscall
kratos::Simulator::get_complex_value_
          (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
           *__return_storage_ptr__,Simulator *this,Var *var)

{
  uint uVar1;
  pointer puVar2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  int iVar5;
  undefined4 extraout_var;
  pair<unsigned_int,_unsigned_int> pVar6;
  mapped_type *pmVar7;
  InternalException *this_00;
  __hash_code __code;
  ulong uVar8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  optional<unsigned_long> oVar11;
  initializer_list<unsigned_long> __l;
  _Storage<unsigned_long,_true> local_90;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  index;
  pointer puStack_70;
  pointer local_68;
  Var *local_60;
  Var *var_local;
  mapped_type values;
  Var *local_38;
  Var *root;
  
  if (var == (Var *)0x0) {
LAB_00206e0c:
    (__return_storage_ptr__->
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _M_engaged = false;
    return __return_storage_ptr__;
  }
  puVar2 = (var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_60 = var;
  if (((long)(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)puVar2 == 4) && (*puVar2 == 1)) {
    oVar11 = get_value_(this,var);
    local_90._M_value =
         oVar11.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    if (((undefined1  [16])
         oVar11.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
        (undefined1  [16])0x0) goto LAB_00206e0c;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_90;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&var_local,__l,
               (allocator_type *)
               &index.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    *(Var **)&(__return_storage_ptr__->
              super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ._M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl = var_local;
    (__return_storage_ptr__->
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
LAB_00206e06:
    (__return_storage_ptr__->
    super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _M_engaged = true;
    return __return_storage_ptr__;
  }
  if (var->type_ != Slice) {
    uVar3 = (this->complex_values_)._M_h._M_bucket_count;
    uVar8 = (ulong)var % uVar3;
    p_Var9 = (this->complex_values_)._M_h._M_buckets[uVar8];
    p_Var10 = (__node_base_ptr)0x0;
    if ((p_Var9 != (__node_base_ptr)0x0) &&
       (p_Var4 = p_Var9->_M_nxt, p_Var10 = p_Var9, (Var *)p_Var9->_M_nxt[1]._M_nxt != var)) {
      while (p_Var9 = p_Var4, p_Var4 = p_Var9->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var10 = (__node_base_ptr)0x0;
        if (((ulong)p_Var4[1]._M_nxt % uVar3 != uVar8) ||
           (p_Var10 = p_Var9, (Var *)p_Var4[1]._M_nxt == var)) goto LAB_00206de0;
      }
      p_Var10 = (__node_base_ptr)0x0;
    }
LAB_00206de0:
    if ((p_Var10 == (__node_base_ptr)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0))
    goto LAB_00206e0c;
    pmVar7 = std::__detail::
             _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->complex_values_,&local_60);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__return_storage_ptr__,
               pmVar7);
    goto LAB_00206e06;
  }
  iVar5 = (*(var->super_IRNode)._vptr_IRNode[0x28])(var);
  local_38 = (Var *)CONCAT44(extraout_var,iVar5);
  get_slice_index((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&local_90,this,local_60);
  if ((pointer)local_90._M_value !=
      index.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pVar6 = compute_var_high_low
                      (local_38,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 *)&local_90);
    uVar1 = local_38->var_width_;
    if (((int)(((ulong)pVar6 >> 0x20) % (ulong)uVar1) != 0) ||
       ((int)(((ulong)pVar6 & 0xffffffff) % (ulong)uVar1) != uVar1 - 1)) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      var_local = (Var *)&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&var_local,"Misaligned vector slicing","");
      InternalException::InternalException(this_00,(string *)&var_local);
      __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar3 = (this->complex_values_)._M_h._M_bucket_count;
    uVar8 = (ulong)local_38 % uVar3;
    p_Var9 = (this->complex_values_)._M_h._M_buckets[uVar8];
    p_Var10 = (__node_base_ptr)0x0;
    if ((p_Var9 != (__node_base_ptr)0x0) &&
       (p_Var4 = p_Var9->_M_nxt, p_Var10 = p_Var9, local_38 != (Var *)p_Var9->_M_nxt[1]._M_nxt)) {
      while (p_Var9 = p_Var4, p_Var4 = p_Var9->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var10 = (__node_base_ptr)0x0;
        if (((ulong)p_Var4[1]._M_nxt % uVar3 != uVar8) ||
           (p_Var10 = p_Var9, local_38 == (Var *)p_Var4[1]._M_nxt)) goto LAB_00206e23;
      }
      p_Var10 = (__node_base_ptr)0x0;
    }
LAB_00206e23:
    if ((p_Var10 != (__node_base_ptr)0x0) && (p_Var10->_M_nxt != (_Hash_node_base *)0x0)) {
      pmVar7 = std::__detail::
               _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->complex_values_,&local_38);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&var_local,pmVar7);
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                 &index.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(&(var_local->super_IRNode)._vptr_IRNode +
                   ((ulong)pVar6 >> 0x20) / (ulong)local_38->var_width_),
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_start +
                   ((ulong)pVar6 & 0xffffffff) / (ulong)local_38->var_width_ + 1),
                 (allocator_type *)((long)&root + 7));
      *(pointer *)
       &(__return_storage_ptr__->
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl = index.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_70;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload._M_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_68;
      index.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_engaged = true;
      if (var_local != (Var *)0x0) {
        operator_delete(var_local,
                        (long)values.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)var_local);
      }
      goto LAB_00206ed2;
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>).
  _M_payload.
  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
  .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
  _M_engaged = false;
LAB_00206ed2:
  if ((pointer)local_90._M_value == (pointer)0x0) {
    return __return_storage_ptr__;
  }
  operator_delete((void *)local_90,
                  (long)index.
                        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)local_90);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<uint64_t>> Simulator::get_complex_value_(const kratos::Var *var) const {
    if (!var) return std::nullopt;
    if (var->size().size() == 1 && var->size().front() == 1) {
        // this is a scalar
        auto v = get_value_(var);
        if (v)
            return std::vector<uint64_t>{*v};
        else
            return std::nullopt;
    }
    if (var->type() == VarType::Slice) {
        auto const *root = var->get_var_root_parent();
        auto index = get_slice_index(var);
        if (index.empty()) return std::nullopt;
        auto const [var_high, var_low] = compute_var_high_low(root, index);
        if (var_low % root->var_width() != 0 ||
            (var_high % root->var_width() != root->var_width() - 1))
            throw InternalException("Misaligned vector slicing");
        if (complex_values_.find(root) == complex_values_.end()) return std::nullopt;
        auto values = complex_values_.at(root);
        // compute the slice range
        auto low = var_low / root->var_width();
        auto high = var_high / root->var_width();
        return std::vector<uint64_t>(values.begin() + low, values.end() + high + 1);
    } else {
        if (complex_values_.find(var) == complex_values_.end()) return std::nullopt;
        return complex_values_.at(var);
    }
}